

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

void __thiscall mkvparser::Track::~Track(Track *this)

{
  ContentEncoding **ppCVar1;
  ContentEncoding *this_00;
  ContentEncoding **ppCVar2;
  
  this->_vptr_Track = (_func_int **)&PTR__Track_005c7358;
  Info::Clear(&this->m_info);
  ppCVar2 = this->content_encoding_entries_;
  ppCVar1 = this->content_encoding_entries_end_;
  if (ppCVar2 != ppCVar1) {
    do {
      this_00 = *ppCVar2;
      if (this_00 != (ContentEncoding *)0x0) {
        ContentEncoding::~ContentEncoding(this_00);
      }
      ppCVar2 = ppCVar2 + 1;
      operator_delete(this_00);
    } while (ppCVar2 != ppCVar1);
    ppCVar2 = this->content_encoding_entries_;
  }
  if (ppCVar2 != (ContentEncoding **)0x0) {
    operator_delete__(ppCVar2);
  }
  Info::~Info(&this->m_info);
  return;
}

Assistant:

Track::~Track() {
  Info& info = const_cast<Info&>(m_info);
  info.Clear();

  ContentEncoding** i = content_encoding_entries_;
  ContentEncoding** const j = content_encoding_entries_end_;

  while (i != j) {
    ContentEncoding* const encoding = *i++;
    delete encoding;
  }

  delete[] content_encoding_entries_;
}